

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

RefI31 * __thiscall wasm::Builder::makeRefI31(Builder *this,Expression *value,Shareability share)

{
  BasicHeapType id;
  HeapType local_38;
  Type local_30;
  RefI31 *local_28;
  RefI31 *ret;
  Expression *pEStack_18;
  Shareability share_local;
  Expression *value_local;
  Builder *this_local;
  
  ret._4_4_ = share;
  pEStack_18 = value;
  value_local = (Expression *)this;
  local_28 = MixedArena::alloc<wasm::RefI31>(&this->wasm->allocator);
  local_28->value = pEStack_18;
  id = HeapType::getBasic((HeapType *)&HeapTypes::i31,ret._4_4_);
  HeapType::HeapType(&local_38,id);
  Type::Type(&local_30,local_38,NonNullable,Inexact);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.type.id =
       local_30.id;
  ::wasm::RefI31::finalize();
  return local_28;
}

Assistant:

RefI31* makeRefI31(Expression* value, Shareability share = Unshared) {
    auto* ret = wasm.allocator.alloc<RefI31>();
    ret->value = value;
    ret->type = Type(HeapTypes::i31.getBasic(share), NonNullable);
    ret->finalize();
    return ret;
  }